

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::SetValueForKey(FConfigFile *this,char *key,char *value,bool duplicates)

{
  FConfigSection *section;
  FConfigEntry *this_00;
  
  section = this->CurrentSection;
  if (section == (FConfigSection *)0x0) {
    return;
  }
  if (!duplicates) {
    this_00 = FindEntry(this,section,key);
    if (this_00 != (FConfigEntry *)0x0) {
      FConfigEntry::SetValue(this_00,value);
      return;
    }
  }
  NewConfigEntry(this,section,key,value);
  return;
}

Assistant:

void FConfigFile::SetValueForKey (const char *key, const char *value, bool duplicates)
{
	if (CurrentSection != NULL)
	{
		FConfigEntry *entry;

		if (duplicates || (entry = FindEntry (CurrentSection, key)) == NULL)
		{
			NewConfigEntry (CurrentSection, key, value);
		}
		else
		{
			entry->SetValue (value);
		}
	}
}